

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep * triggerStepAllocate(sqlite3 *db,u8 op,Token *pName)

{
  TriggerStep *pTVar1;
  TriggerStep *z_00;
  char *z;
  TriggerStep *pTriggerStep;
  Token *pName_local;
  u8 op_local;
  sqlite3 *db_local;
  
  pTVar1 = (TriggerStep *)sqlite3DbMallocZero(db,(ulong)pName->n + 0x49);
  if (pTVar1 != (TriggerStep *)0x0) {
    z_00 = pTVar1 + 1;
    memcpy(z_00,pName->z,(ulong)pName->n);
    sqlite3Dequote((char *)z_00);
    pTVar1->zTarget = (char *)z_00;
    pTVar1->op = op;
  }
  return pTVar1;
}

Assistant:

static TriggerStep *triggerStepAllocate(
  sqlite3 *db,                /* Database connection */
  u8 op,                      /* Trigger opcode */
  Token *pName                /* The target name */
){
  TriggerStep *pTriggerStep;

  pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep) + pName->n + 1);
  if( pTriggerStep ){
    char *z = (char*)&pTriggerStep[1];
    memcpy(z, pName->z, pName->n);
    sqlite3Dequote(z);
    pTriggerStep->zTarget = z;
    pTriggerStep->op = op;
  }
  return pTriggerStep;
}